

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ProducerIPCService::CommitData
          (ProducerIPCService *this,CommitDataRequest *req,DeferredCommitDataResponse *resp)

{
  ProducerEndpoint *pPVar1;
  RemoteProducer *pRVar2;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  function<void_()> local_58;
  _Any_data local_38;
  undefined8 uStack_28;
  undefined8 local_20;
  
  pRVar2 = GetProducerForCurrentRequest(this);
  if (pRVar2 == (RemoteProducer *)0x0) {
    if ((resp->super_DeferredBase).callback_.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      ipc::DeferredBase::Reject(&resp->super_DeferredBase);
      return;
    }
  }
  else {
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (DeferredCommitDataResponse *)0x0;
    local_78._8_8_ = 0;
    if ((resp->super_DeferredBase).callback_.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      uStack_28 = 0;
      local_78._8_8_ = 0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_20 = 0;
      local_68 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:74260:16)>
                 ::_M_manager;
      pcStack_60 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:74260:16)>
                   ::_M_invoke;
      local_78._M_unused._M_object = resp;
      ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
    }
    pPVar1 = (pRVar2->service_endpoint)._M_t.
             super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
             .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
    ::std::function<void_()>::function(&local_58,(function<void_()> *)&local_78);
    (*pPVar1->_vptr_ProducerEndpoint[7])(pPVar1,req,&local_58);
    ::std::_Function_base::~_Function_base(&local_58.super__Function_base);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  return;
}

Assistant:

void ProducerIPCService::CommitData(const protos::gen::CommitDataRequest& req,
                                    DeferredCommitDataResponse resp) {
  RemoteProducer* producer = GetProducerForCurrentRequest();
  if (!producer) {
    PERFETTO_DLOG(
        "Producer invoked CommitData() before InitializeConnection()");
    if (resp.IsBound())
      resp.Reject();
    return;
  }

  // We don't want to send a response if the client didn't attach a callback to
  // the original request. Doing so would generate unnecessary wakeups and
  // context switches.
  std::function<void()> callback;
  if (resp.IsBound()) {
    // Capturing |resp| by reference here speculates on the fact that
    // CommitData() in tracing_service_impl.cc invokes the passed callback
    // inline, without posting it. If that assumption changes this code needs to
    // wrap the response in a shared_ptr (C+11 lambdas don't support move) and
    // use a weak ptr in the caller.
    callback = [&resp] {
      resp.Resolve(ipc::AsyncResult<protos::gen::CommitDataResponse>::Create());
    };
  }
  producer->service_endpoint->CommitData(req, callback);
}